

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O1

bool __thiscall soul::FunctionBuilder::checkFunctionBlocksForTermination(FunctionBuilder *this)

{
  Function *pFVar1;
  Block *pBVar2;
  Function *pFVar3;
  Block *pBVar4;
  PoolItem *pPVar5;
  long lVar6;
  ulong uVar7;
  code *pcVar8;
  pointer ppVar9;
  ulong uVar10;
  bool bVar11;
  
  pFVar1 = (this->currentFunction).object;
  if (pFVar1 != (Function *)0x0) {
    if ((pFVar1->blocks).
        super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pFVar1->blocks).
        super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ensureBlockIsReady(this);
    }
    ppVar9 = (pFVar1->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(pFVar1->blocks).
                  super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9;
    bVar11 = lVar6 == 0;
    if (!bVar11) {
      uVar7 = lVar6 >> 3;
      uVar10 = 0;
      do {
        pBVar2 = ppVar9[uVar10].object;
        if ((pBVar2->terminator).object == (Terminator *)0x0) {
          if (uVar10 == uVar7 - 1) {
            pFVar3 = (this->currentFunction).object;
            if (pFVar3 == (Function *)0x0) goto LAB_00220c00;
            if ((pFVar3->returnType).primitiveType.type != void_) {
              return bVar11;
            }
            pPVar5 = PoolAllocator::allocateSpaceForObject
                               (&((this->super_BlockBuilder).module)->allocator->pool,0x18);
            pPVar5->item = (void *)0x0;
            *(undefined8 *)&pPVar5->field_0x18 = 0;
            pPVar5[1].size = 0;
            pPVar5->item = &PTR__Object_002d9798;
            pcVar8 = PoolAllocator::allocate<soul::heart::ReturnVoid>::anon_class_1_0_00000001::
                     __invoke;
          }
          else {
            pPVar5 = PoolAllocator::allocateSpaceForObject
                               (&((this->super_BlockBuilder).module)->allocator->pool,0x58);
            pBVar4 = ppVar9[uVar10 + 1].object;
            *(undefined8 *)&pPVar5->field_0x18 = 0;
            pPVar5[1].size = 0;
            pPVar5->item = &PTR__Branch_002d9ee0;
            pPVar5[1].destructor = (DestructorFn *)pBVar4;
            pPVar5[1].item = &pPVar5[2].destructor;
            *(undefined8 *)&pPVar5[1].field_0x18 = 0;
            pPVar5[2].size = 4;
            pcVar8 = PoolAllocator::
                     allocate<soul::heart::Branch,_soul::pool_ref<soul::heart::Block>_&>::
                     anon_class_1_0_00000001::__invoke;
          }
          pPVar5->destructor = pcVar8;
          (pBVar2->terminator).object = (Terminator *)&pPVar5->item;
        }
        uVar10 = uVar10 + 1;
        ppVar9 = (pFVar1->blocks).
                 super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(pFVar1->blocks).
                      super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 3;
        bVar11 = uVar10 >= uVar7;
      } while (uVar10 < uVar7);
    }
    return bVar11;
  }
LAB_00220c00:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

heart::Variable& createVariable (Type type, StringType&& name, heart::Variable::Role role)
    {
        return createVariable (module, std::move (type), std::move (name), role);
    }